

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O3

ssize_t __thiscall
capnp::Request<capnp::AnyPointer,_capnp::AnyPointer>::send
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *this,int __fd,void *__buf,size_t __n,
          int __flags)

{
  long *plVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 in_register_00000034;
  long lVar8;
  Own<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,_capnp::Response<capnp::AnyPointer>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_h:769:13),_kj::_::PropagateException>_>
  OVar9;
  PropagateException local_61;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  CapTableBuilder *local_30;
  Own<kj::_::PromiseNode> local_28;
  
  lVar8 = CONCAT44(in_register_00000034,__fd);
  (**(code **)**(undefined8 **)(lVar8 + 0x20))(&local_60);
  plVar1 = *(long **)(lVar8 + 0x20);
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)(lVar8 + 0x20) = 0;
    (**(code **)**(undefined8 **)(lVar8 + 0x18))
              (*(undefined8 **)(lVar8 + 0x18),(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  OVar9 = kj::
          heap<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,capnp::Response<capnp::AnyPointer>,capnp::Request<capnp::AnyPointer,capnp::AnyPointer>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::Request<capnp::AnyPointer,capnp::AnyPointer>::send()::_lambda(capnp::Response<capnp::AnyPointer>&&)_1_,kj::_::PropagateException>
                    (&local_28,(anon_class_1_0_00000001_for_func *)&local_60,&local_61);
  plVar1 = local_58;
  uVar4 = (undefined4)local_40;
  uVar5 = local_40._4_4_;
  uVar6 = (undefined4)uStack_38;
  uVar7 = uStack_38._4_4_;
  local_40 = 0;
  uStack_38 = 0;
  (this->super_Builder).builder.segment = (SegmentBuilder *)local_28.disposer;
  (this->super_Builder).builder.capTable = (CapTableBuilder *)local_28.ptr;
  uVar2 = (undefined4)uStack_48;
  uVar3 = uStack_48._4_4_;
  uStack_48 = 0;
  *(undefined4 *)&(this->super_Builder).builder.pointer = local_50;
  *(undefined4 *)((long)&(this->super_Builder).builder.pointer + 4) = uStack_4c;
  *(undefined4 *)&(this->hook).disposer = uVar2;
  *(undefined4 *)((long)&(this->hook).disposer + 4) = uVar3;
  *(undefined4 *)&(this->hook).ptr = uVar4;
  *(undefined4 *)((long)&(this->hook).ptr + 4) = uVar5;
  *(undefined4 *)&this[1].super_Builder.builder.segment = uVar6;
  *(undefined4 *)((long)&this[1].super_Builder.builder.segment + 4) = uVar7;
  this[1].super_Builder.builder.capTable = local_30;
  if (local_58 != (long *)0x0) {
    local_58 = (long *)0x0;
    (**(code **)*local_60)(local_60,(long)plVar1 + *(long *)(*plVar1 + -0x10),OVar9.ptr);
  }
  return (ssize_t)this;
}

Assistant:

RemotePromise<Results> Request<Params, Results>::send() {
  auto typelessPromise = hook->send();
  hook = nullptr;  // prevent reuse

  // Convert the Promise to return the correct response type.
  // Explicitly upcast to kj::Promise to make clear that calling .then() doesn't invalidate the
  // Pipeline part of the RemotePromise.
  auto typedPromise = kj::implicitCast<kj::Promise<Response<AnyPointer>>&>(typelessPromise)
      .then([](Response<AnyPointer>&& response) -> Response<Results> {
        return Response<Results>(response.getAs<Results>(), kj::mv(response.hook));
      });

  // Wrap the typeless pipeline in a typed wrapper.
  typename Results::Pipeline typedPipeline(
      kj::mv(kj::implicitCast<AnyPointer::Pipeline&>(typelessPromise)));

  return RemotePromise<Results>(kj::mv(typedPromise), kj::mv(typedPipeline));
}